

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ExceptionOptions>::construct
          (BasicTypeInfo<dap::ExceptionOptions> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ExceptionOptions> *this_local;
  
  memset(ptr,0,0x40);
  ExceptionOptions::ExceptionOptions((ExceptionOptions *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }